

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O3

void __thiscall ExampleAppConsole::ExampleAppConsole(ExampleAppConsole *this)

{
  char **ppcVar1;
  char **ppcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  (this->History).Size = 0;
  (this->History).Capacity = 0;
  (this->History).Data = (char **)0x0;
  (this->Commands).Size = 0;
  (this->Commands).Capacity = 0;
  (this->Commands).Data = (char **)0x0;
  (this->Items).Size = 0;
  (this->Items).Capacity = 0;
  (this->Items).Data = (char **)0x0;
  ImGuiTextFilter::ImGuiTextFilter(&this->Filter,"");
  ClearLog(this);
  memset(this,0,0x100);
  this->HistoryPos = -1;
  iVar4 = (this->Commands).Size;
  if (iVar4 == (this->Commands).Capacity) {
    if (iVar4 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar4 / 2 + iVar4;
    }
    iVar5 = iVar4 + 1;
    if (iVar4 + 1 < iVar3) {
      iVar5 = iVar3;
    }
    ppcVar2 = (char **)ImGui::MemAlloc((long)iVar5 << 3);
    ppcVar1 = (this->Commands).Data;
    if (ppcVar1 != (char **)0x0) {
      memcpy(ppcVar2,ppcVar1,(long)(this->Commands).Size << 3);
      ImGui::MemFree((this->Commands).Data);
    }
    (this->Commands).Data = ppcVar2;
    (this->Commands).Capacity = iVar5;
    iVar4 = (this->Commands).Size;
  }
  else {
    ppcVar2 = (this->Commands).Data;
  }
  ppcVar2[iVar4] = "HELP";
  iVar3 = (this->Commands).Size;
  iVar4 = iVar3 + 1;
  (this->Commands).Size = iVar4;
  if (iVar4 == (this->Commands).Capacity) {
    iVar3 = iVar3 + 2;
    if (iVar4 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar4 / 2 + iVar4;
    }
    if (iVar3 < iVar4) {
      iVar3 = iVar4;
    }
    ppcVar2 = (char **)ImGui::MemAlloc((long)iVar3 << 3);
    ppcVar1 = (this->Commands).Data;
    if (ppcVar1 != (char **)0x0) {
      memcpy(ppcVar2,ppcVar1,(long)(this->Commands).Size << 3);
      ImGui::MemFree((this->Commands).Data);
    }
    (this->Commands).Data = ppcVar2;
    (this->Commands).Capacity = iVar3;
    iVar4 = (this->Commands).Size;
  }
  else {
    ppcVar2 = (this->Commands).Data;
  }
  ppcVar2[iVar4] = "HISTORY";
  iVar3 = (this->Commands).Size;
  iVar4 = iVar3 + 1;
  (this->Commands).Size = iVar4;
  if (iVar4 == (this->Commands).Capacity) {
    iVar3 = iVar3 + 2;
    if (iVar4 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar4 / 2 + iVar4;
    }
    if (iVar3 < iVar4) {
      iVar3 = iVar4;
    }
    ppcVar2 = (char **)ImGui::MemAlloc((long)iVar3 << 3);
    ppcVar1 = (this->Commands).Data;
    if (ppcVar1 != (char **)0x0) {
      memcpy(ppcVar2,ppcVar1,(long)(this->Commands).Size << 3);
      ImGui::MemFree((this->Commands).Data);
    }
    (this->Commands).Data = ppcVar2;
    (this->Commands).Capacity = iVar3;
    iVar4 = (this->Commands).Size;
  }
  else {
    ppcVar2 = (this->Commands).Data;
  }
  ppcVar2[iVar4] = "CLEAR";
  iVar3 = (this->Commands).Size;
  iVar4 = iVar3 + 1;
  (this->Commands).Size = iVar4;
  if (iVar4 == (this->Commands).Capacity) {
    iVar3 = iVar3 + 2;
    if (iVar4 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar4 / 2 + iVar4;
    }
    if (iVar3 < iVar4) {
      iVar3 = iVar4;
    }
    ppcVar2 = (char **)ImGui::MemAlloc((long)iVar3 << 3);
    ppcVar1 = (this->Commands).Data;
    if (ppcVar1 != (char **)0x0) {
      memcpy(ppcVar2,ppcVar1,(long)(this->Commands).Size << 3);
      ImGui::MemFree((this->Commands).Data);
    }
    (this->Commands).Data = ppcVar2;
    (this->Commands).Capacity = iVar3;
    iVar4 = (this->Commands).Size;
  }
  else {
    ppcVar2 = (this->Commands).Data;
  }
  ppcVar2[iVar4] = "CLASSIFY";
  (this->Commands).Size = (this->Commands).Size + 1;
  this->AutoScroll = true;
  this->ScrollToBottom = false;
  AddLog(this,"Welcome to Dear ImGui!");
  return;
}

Assistant:

ExampleAppConsole()
    {
        ClearLog();
        memset(InputBuf, 0, sizeof(InputBuf));
        HistoryPos = -1;

        // "CLASSIFY" is here to provide the test case where "C"+[tab] completes to "CL" and display multiple matches.
        Commands.push_back("HELP");
        Commands.push_back("HISTORY");
        Commands.push_back("CLEAR");
        Commands.push_back("CLASSIFY");
        AutoScroll = true;
        ScrollToBottom = false;
        AddLog("Welcome to Dear ImGui!");
    }